

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
NLReaderTest_OnUnhandledDispatch_Test::TestBody(NLReaderTest_OnUnhandledDispatch_Test *this)

{
  MockSpec<void_(const_char_*)> *pMVar1;
  MockNLHandler handler;
  allocator<char> local_499;
  MatcherBase<const_char_*> local_498;
  string local_480;
  NLHeader local_460;
  MockNLHandler local_350;
  
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"NL header",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x64f,"handler","OnUnhandled(testing::StrEq(\"NL header\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  memset(&local_460,0,0x110);
  mp::NLHeader::NLHeader(&local_460);
  MockNLHandler::OnUnhandled(&local_350,"NL header");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"objective",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x650,"handler","OnUnhandled(testing::StrEq(\"objective\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"objective");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"nonlinear constraint",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x651,"handler","OnUnhandled(testing::StrEq(\"nonlinear constraint\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"nonlinear constraint");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"logical constraint",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x652,"handler","OnUnhandled(testing::StrEq(\"logical constraint\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"logical constraint");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"common expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x653,"handler","OnUnhandled(testing::StrEq(\"common expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"common expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"common expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x654,"handler","OnUnhandled(testing::StrEq(\"common expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"common expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"complementarity constraint",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x656,"handler","OnUnhandled(testing::StrEq(\"complementarity constraint\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"complementarity constraint");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"linear objective",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x657,"handler","OnUnhandled(testing::StrEq(\"linear objective\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"linear objective");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"linear constraint",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x658,"handler","OnUnhandled(testing::StrEq(\"linear constraint\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"linear constraint");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"linear common expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x659,"handler","OnUnhandled(testing::StrEq(\"linear common expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"linear common expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"variable bounds",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65a,"handler","OnUnhandled(testing::StrEq(\"variable bounds\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"variable bounds");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"constraint bounds",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65b,"handler","OnUnhandled(testing::StrEq(\"constraint bounds\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"constraint bounds");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"initial value",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65c,"handler","OnUnhandled(testing::StrEq(\"initial value\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"initial value");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"initial dual value",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65d,"handler","OnUnhandled(testing::StrEq(\"initial dual value\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"initial dual value");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"column sizes",&local_499)
  ;
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65e,"handler","OnUnhandled(testing::StrEq(\"column sizes\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnColumnSizes
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"function",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65f,"handler","OnUnhandled(testing::StrEq(\"function\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"function");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"integer suffix",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x660,"handler","OnUnhandled(testing::StrEq(\"integer suffix\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"integer suffix");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"double suffix",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x661,"handler","OnUnhandled(testing::StrEq(\"double suffix\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"double suffix");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"number",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x662,"handler","OnUnhandled(testing::StrEq(\"number\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"number");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"variable reference",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x663,"handler","OnUnhandled(testing::StrEq(\"variable reference\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"variable reference");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"common expression reference",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x664,"handler","OnUnhandled(testing::StrEq(\"common expression reference\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"common expression reference");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"unary expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x665,"handler","OnUnhandled(testing::StrEq(\"unary expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"unary expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"binary expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x667,"handler","OnUnhandled(testing::StrEq(\"binary expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"binary expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"if expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x668,"handler","OnUnhandled(testing::StrEq(\"if expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"if expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"piecewise-linear term",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x669,"handler","OnUnhandled(testing::StrEq(\"piecewise-linear term\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"piecewise-linear term");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"piecewise-linear term",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x66b,"handler","OnUnhandled(testing::StrEq(\"piecewise-linear term\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"piecewise-linear term");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"call expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x66c,"handler","OnUnhandled(testing::StrEq(\"call expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"call expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"call expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x66d,"handler","OnUnhandled(testing::StrEq(\"call expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCall
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"vararg expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x66e,"handler","OnUnhandled(testing::StrEq(\"vararg expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"vararg expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"vararg expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x670,"handler","OnUnhandled(testing::StrEq(\"vararg expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndVarArg
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"summation",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x671,"handler","OnUnhandled(testing::StrEq(\"summation\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"summation");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"summation",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x672,"handler","OnUnhandled(testing::StrEq(\"summation\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndSum
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"count expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x673,"handler","OnUnhandled(testing::StrEq(\"count expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"count expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"count expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x675,"handler","OnUnhandled(testing::StrEq(\"count expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCount
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"numberof expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x676,"handler","OnUnhandled(testing::StrEq(\"numberof expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"numberof expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"numberof expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x678,"handler","OnUnhandled(testing::StrEq(\"numberof expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndNumberOf
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"symbolic numberof expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x67a,"handler","OnUnhandled(testing::StrEq(\"symbolic numberof expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"symbolic numberof expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"symbolic numberof expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x67c,"handler","OnUnhandled(testing::StrEq(\"symbolic numberof expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndSymbolicNumberOf
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"bool",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x67d,"handler","OnUnhandled(testing::StrEq(\"bool\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"bool");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"logical not",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x67e,"handler","OnUnhandled(testing::StrEq(\"logical not\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"logical not");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"binary logical expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x680,"handler","OnUnhandled(testing::StrEq(\"binary logical expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"binary logical expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"relational expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x682,"handler","OnUnhandled(testing::StrEq(\"relational expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"relational expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"logical count expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x684,"handler","OnUnhandled(testing::StrEq(\"logical count expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"logical count expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"implication expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x686,"handler","OnUnhandled(testing::StrEq(\"implication expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"implication expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"iterated logical expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x688,"handler","OnUnhandled(testing::StrEq(\"iterated logical expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"iterated logical expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"iterated logical expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x68a,"handler","OnUnhandled(testing::StrEq(\"iterated logical expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndIteratedLogical
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"pairwise expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x68c,"handler","OnUnhandled(testing::StrEq(\"pairwise expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"pairwise expression");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"pairwise expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x68e,"handler","OnUnhandled(testing::StrEq(\"pairwise expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndPairwise
            (&local_350.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>);
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"string",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x68f,"handler","OnUnhandled(testing::StrEq(\"string\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"string");
  MockNLHandler::~MockNLHandler(&local_350);
  MockNLHandler::MockNLHandler(&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"symbolic if expression",&local_499);
  testing::StrEq((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_460,&local_480);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_498,(PolymorphicMatcher *)&local_460);
  pMVar1 = MockNLHandler::gmock_OnUnhandled(&local_350,(Matcher<const_char_*> *)&local_498);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x691,"handler","OnUnhandled(testing::StrEq(\"symbolic if expression\"))");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_498);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  MockNLHandler::OnUnhandled(&local_350,"symbolic if expression");
  MockNLHandler::~MockNLHandler(&local_350);
  return;
}

Assistant:

TEST(NLReaderTest, OnUnhandledDispatch) {
  EXPECT_UNHANDLED("NL header", OnHeader(mp::NLHeader()));
  EXPECT_UNHANDLED("objective", OnObj(0, mp::obj::MAX, TestExpr()));
  EXPECT_UNHANDLED("nonlinear constraint", OnAlgebraicCon(0, TestExpr()));
  EXPECT_UNHANDLED("logical constraint", OnLogicalCon(0, TestExpr()));
  EXPECT_UNHANDLED("common expression", BeginCommonExpr(0, 0));
  EXPECT_UNHANDLED("common expression", EndCommonExpr(0, TestExpr(), 0));
  EXPECT_UNHANDLED("complementarity constraint",
                   OnComplementarity(0, 0, mp::ComplInfo(0)));
  EXPECT_UNHANDLED("linear objective", OnLinearObjExpr(0, 0));
  EXPECT_UNHANDLED("linear constraint", OnLinearConExpr(0, 0));
  EXPECT_UNHANDLED("linear common expression", OnLinearCommonExpr(0, 0));
  EXPECT_UNHANDLED("variable bounds", OnVarBounds(0, 0, 0));
  EXPECT_UNHANDLED("constraint bounds", OnConBounds(0, 0, 0));
  EXPECT_UNHANDLED("initial value", OnInitialValue(0, 0));
  EXPECT_UNHANDLED("initial dual value", OnInitialDualValue(0, 0));
  EXPECT_UNHANDLED("column sizes", OnColumnSizes());
  EXPECT_UNHANDLED("function", OnFunction(0, "", 0, mp::func::NUMERIC));
  EXPECT_UNHANDLED("integer suffix", OnIntSuffix("",  mp::suf::OBJ, 0));
  EXPECT_UNHANDLED("double suffix", OnDblSuffix("",  mp::suf::OBJ, 0));
  EXPECT_UNHANDLED("number", OnNumber(0));
  EXPECT_UNHANDLED("variable reference", OnVariableRef(0));
  EXPECT_UNHANDLED("common expression reference", OnCommonExprRef(0));
  EXPECT_UNHANDLED("unary expression", OnUnary(expr::MINUS, TestExpr()));
  EXPECT_UNHANDLED("binary expression",
                   OnBinary(expr::ADD, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("if expression", OnIf(TestExpr(), TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("piecewise-linear term", BeginPLTerm(0));
  EXPECT_UNHANDLED("piecewise-linear term",
                   EndPLTerm(MockNLHandler::PLTermHandler(), TestExpr()));
  EXPECT_UNHANDLED("call expression", BeginCall(0, 0));
  EXPECT_UNHANDLED("call expression", EndCall(MockNLHandler::CallArgHandler()));
  EXPECT_UNHANDLED("vararg expression", BeginVarArg(mp::expr::MIN, 0));
  EXPECT_UNHANDLED("vararg expression",
                   EndVarArg(MockNLHandler::VarArgHandler()));
  EXPECT_UNHANDLED("summation", BeginSum(0));
  EXPECT_UNHANDLED("summation", EndSum(MockNLHandler::NumericArgHandler()));
  EXPECT_UNHANDLED("count expression", BeginCount(0));
  EXPECT_UNHANDLED("count expression",
                   EndCount(MockNLHandler::CountArgHandler()));
  EXPECT_UNHANDLED("numberof expression", BeginNumberOf(0, TestExpr()));
  EXPECT_UNHANDLED("numberof expression",
                   EndNumberOf(MockNLHandler::NumberOfArgHandler()));
  EXPECT_UNHANDLED("symbolic numberof expression",
                   BeginSymbolicNumberOf(0, TestExpr()));
  EXPECT_UNHANDLED("symbolic numberof expression",
                   EndSymbolicNumberOf(MockNLHandler::SymbolicArgHandler()));
  EXPECT_UNHANDLED("bool", OnBool(true));
  EXPECT_UNHANDLED("logical not", OnNot(TestExpr()));
  EXPECT_UNHANDLED("binary logical expression",
                   OnBinaryLogical(mp::expr::OR, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("relational expression",
                   OnRelational(mp::expr::LT, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("logical count expression",
                   OnLogicalCount(mp::expr::ATMOST, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("implication expression",
                   OnImplication(TestExpr(), TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("iterated logical expression",
                   BeginIteratedLogical(mp::expr::EXISTS, 0));
  EXPECT_UNHANDLED("iterated logical expression",
                   EndIteratedLogical(MockNLHandler::LogicalArgHandler()));
  EXPECT_UNHANDLED("pairwise expression",
                   BeginPairwise(mp::expr::ALLDIFF, 0));
  EXPECT_UNHANDLED("pairwise expression",
                   EndPairwise(MockNLHandler::PairwiseArgHandler()));
  EXPECT_UNHANDLED("string", OnString(""));
  EXPECT_UNHANDLED("symbolic if expression",
                   OnSymbolicIf(TestExpr(), TestExpr(), TestExpr()));
}